

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusplatforminputcontext.cpp
# Opt level: O2

void __thiscall
QIBusPlatformInputContext::commitText(QIBusPlatformInputContext *this,QDBusVariant *text)

{
  long lVar1;
  QObject *pQVar2;
  QDebug *this_00;
  long in_FS_OFFSET;
  QInputMethodEvent event;
  QDBusArgument arg;
  QIBusText t;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  char *pcStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  QArrayDataPointer<char16_t> local_d8;
  QDebug local_b8;
  undefined1 local_b0 [8];
  QIBusText local_a8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QObject *)QGuiApplication::focusObject();
  if (pQVar2 != (QObject *)0x0) {
    local_b0 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
    QVariant::QVariant((QVariant *)(local_b0 + 8),&text->m_variant);
    qvariant_cast<QDBusArgument>((QVariant *)local_b0);
    QVariant::~QVariant((QVariant *)(local_b0 + 8));
    local_a8.attributes.attributes.d.ptr = (QIBusAttribute *)0xaaaaaaaaaaaaaaaa;
    local_a8.attributes.attributes.d.size = -0x5555555555555556;
    local_a8.attributes.super_QIBusSerializable.attachments.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.attributes.attributes.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.attributes.super_QIBusSerializable.name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_a8.attributes.super_QIBusSerializable.name.d.size = -0x5555555555555556;
    local_a8.text.d.size = -0x5555555555555556;
    local_a8.attributes.super_QIBusSerializable.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.text.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.text.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_a8.super_QIBusSerializable.name.d.size = -0x5555555555555556;
    local_a8.super_QIBusSerializable.attachments.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.super_QIBusSerializable.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.super_QIBusSerializable.name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QIBusText::QIBusText((QIBusText *)(local_b0 + 8));
    lcQpaInputMethods();
    if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      local_138 = 2;
      uStack_134 = 0;
      uStack_130 = 0;
      uStack_12c = 0;
      uStack_128 = 0;
      uStack_124 = 0;
      pcStack_120 = lcQpaInputMethods::category.name;
      QMessageLogger::debug();
      QDBusArgument::currentSignature();
      QDebug::operator<<(&local_b8,(QString *)&local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QDebug::~QDebug(&local_b8);
    }
    QIBusText::deserializeFrom((QIBusText *)(local_b0 + 8),(QDBusArgument *)local_b0);
    lcQpaInputMethods();
    if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      local_138 = 2;
      uStack_134 = 0;
      uStack_130 = 0;
      uStack_12c = 0;
      uStack_128 = 0;
      uStack_124 = 0;
      pcStack_120 = lcQpaInputMethods::category.name;
      QMessageLogger::debug();
      this_00 = QDebug::operator<<((QDebug *)&local_d8,"commit text:");
      QDebug::operator<<(this_00,&local_a8.text);
      QDebug::~QDebug((QDebug *)&local_d8);
    }
    local_e8 = 0xaaaaaaaaaaaaaaaa;
    uStack_e0 = 0xaaaaaaaaaaaaaaaa;
    local_f8 = 0xaaaaaaaaaaaaaaaa;
    uStack_f0 = 0xaaaaaaaaaaaaaaaa;
    local_108 = 0xaaaaaaaaaaaaaaaa;
    uStack_100 = 0xaaaaaaaaaaaaaaaa;
    local_118 = 0xaaaaaaaaaaaaaaaa;
    uStack_110 = 0xaaaaaaaaaaaaaaaa;
    uStack_128 = 0xaaaaaaaa;
    uStack_124 = 0xaaaaaaaa;
    pcStack_120 = (char *)0xaaaaaaaaaaaaaaaa;
    local_138 = 0xaaaaaaaa;
    uStack_134 = 0xaaaaaaaa;
    uStack_130 = 0xaaaaaaaa;
    uStack_12c = 0xaaaaaaaa;
    QInputMethodEvent::QInputMethodEvent((QInputMethodEvent *)&local_138);
    QInputMethodEvent::setCommitString((QString *)&local_138,(int)&local_a8 + 0x20,0);
    QCoreApplication::sendEvent(pQVar2,(QEvent *)&local_138);
    lVar1 = *(long *)(this + 0x18);
    local_d8.d = *(Data **)(lVar1 + 0x30);
    local_d8.ptr = *(char16_t **)(lVar1 + 0x38);
    *(undefined8 *)(lVar1 + 0x30) = 0;
    *(undefined8 *)(lVar1 + 0x38) = 0;
    local_d8.size = *(qsizetype *)(lVar1 + 0x40);
    *(undefined8 *)(lVar1 + 0x40) = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QList<QInputMethodEvent::Attribute>::clear
              ((QList<QInputMethodEvent::Attribute> *)(*(long *)(this + 0x18) + 0x48));
    QInputMethodEvent::~QInputMethodEvent((QInputMethodEvent *)&local_138);
    QIBusText::~QIBusText((QIBusText *)(local_b0 + 8));
    QDBusArgument::~QDBusArgument((QDBusArgument *)local_b0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIBusPlatformInputContext::commitText(const QDBusVariant &text)
{
    QObject *input = qApp->focusObject();
    if (!input)
        return;

    const QDBusArgument arg = qvariant_cast<QDBusArgument>(text.variant());

    QIBusText t;
    qCDebug(lcQpaInputMethods) << arg.currentSignature();
    arg >> t;
    qCDebug(lcQpaInputMethods) << "commit text:" << t.text;

    QInputMethodEvent event;
    event.setCommitString(t.text);
    QCoreApplication::sendEvent(input, &event);

    d->predit = QString();
    d->attributes.clear();
}